

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
  ::deserialize(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *__return_storage_ptr__,istream *in)

{
  pointer pvVar1;
  void *pvVar2;
  undefined1 uVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t i;
  long lVar4;
  pointer pvVar5;
  uint8_t buf [4];
  vector<double,_std::allocator<double>_> local_40;
  
  lVar4 = 0;
  do {
    uVar3 = std::istream::get();
    *(undefined1 *)
     ((long)&local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4) = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(int)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,(allocator_type *)&local_40);
  pvVar5 = (__return_storage_ptr__->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 != pvVar1) {
    do {
      net_serializer<std::vector<double,_std::allocator<double>_>,_void>::deserialize(&local_40,in);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(pvVar5,&local_40);
      pvVar2 = (void *)CONCAT44(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start._4_4_,
                                (int)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      pvVar5 = pvVar5 + 1;
    } while (pvVar5 != pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> deserialize(std::istream& in){
        int size = net_serializer<int>::deserialize(in);
        std::vector<T> data(size);
        for (auto& i:data)
            i = net_serializer<T>::deserialize(in);
        return data;
    }